

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageTexelBuffer::prepare
          (RenderVertexStorageTexelBuffer *this,PrepareRenderPassContext *context)

{
  VkRenderPass renderPass;
  Context *pCVar1;
  InstanceInterface *vk;
  DeviceInterface *deviceInterface;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  VkResult result;
  ProgramBinary *pPVar6;
  ulong uVar7;
  size_t descriptorSetNdx;
  PipelineResources *in_stack_fffffffffffffbb8;
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayout layout;
  DeviceInterface *pDStack_400;
  VkDevice local_3f8;
  VkAllocationCallbacks *pVStack_3f0;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3b8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_398;
  VkDescriptorPoolSize poolSizes;
  VkDescriptorSetLayoutBinding binding;
  deUint32 local_22c;
  
  renderPass.m_internal = (context->m_renderPass).m_internal;
  pCVar1 = context->m_context->m_context;
  vk = pCVar1->m_vki;
  deviceInterface = pCVar1->m_vkd;
  physicalDevice = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  pPVar2 = pCVar1->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocateInfo,"storage-texel-buffer.vert",(allocator<char> *)&local_3b8);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,pPVar6,0);
  local_398.m_data.deleter.m_device = (VkDevice)binding.pImmutableSamplers;
  local_398.m_data.object.m_internal._0_4_ = binding.binding;
  local_398.m_data.object.m_internal._4_4_ = binding.descriptorType;
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&binding);
  std::__cxx11::string::~string((string *)&allocateInfo);
  pPVar2 = context->m_context->m_context->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocateInfo,"render-white.frag",(allocator<char> *)&layout);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,pPVar6,0);
  local_3b8.m_data.deleter.m_device = (VkDevice)binding.pImmutableSamplers;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3b8.m_data.object.m_internal._0_4_ = binding.binding;
  local_3b8.m_data.object.m_internal._4_4_ = binding.descriptorType;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&binding);
  std::__cxx11::string::~string((string *)&allocateInfo);
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_device = device;
  this->m_vkd = deviceInterface;
  this->m_bufferSize = context->m_context->m_currentBufferSize;
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)&binding,vk,physicalDevice);
  this->m_maxStorageTexelCount = local_22c;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
  binding.descriptorCount = 1;
  binding.stageFlags = 1;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back(&bindings,&binding);
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.descriptorPool.m_internal = 0;
  createPipelineWithResources
            (deviceInterface,device,renderPass,(deUint32)&local_398,(VkShaderModule *)&local_3b8,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)&binding,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&allocateInfo,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&bindings,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)&this->m_resources,
             in_stack_fffffffffffffbb8);
  std::
  _Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                   *)&allocateInfo);
  std::
  _Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                   *)&binding);
  auVar3 = ZEXT416(this->m_maxStorageTexelCount) << 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_bufferSize;
  uVar7 = (SUB168(auVar4 / auVar3,0) + 1) - (ulong)(SUB168(auVar4 % auVar3,0) == 0);
  poolSizes.type = VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
  poolSizes.descriptorCount = (deUint32)uVar7;
  binding.binding = 0x21;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)CONCAT44(poolSizes.descriptorCount,1);
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layout,deviceInterface,device,
             (VkDescriptorPoolCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  allocateInfo.descriptorPool.m_internal = (deUint64)local_3f8;
  allocateInfo._24_8_ = pVStack_3f0;
  allocateInfo._0_8_ = layout.m_internal;
  allocateInfo.pNext = pDStack_400;
  layout.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)allocateInfo.descriptorPool.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)allocateInfo._24_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       allocateInfo._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)allocateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&layout);
  uVar7 = uVar7 & 0xffffffff;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  resize(&this->m_descriptorSets,uVar7,(value_type *)&allocateInfo);
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  resize(&this->m_bufferViews,uVar7,(value_type *)&allocateInfo);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->m_descriptorSets).
                            super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_descriptorSets).
                            super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    layout.m_internal =
         (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.
         m_data.object.m_internal;
    allocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    allocateInfo.pNext = (void *)0x0;
    allocateInfo.descriptorPool.m_internal =
         (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
         m_internal;
    allocateInfo.descriptorSetCount = 1;
    allocateInfo.pSetLayouts = &layout;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&binding,deviceInterface,device,
               &allocateInfo);
    uVar5 = binding._0_8_;
    binding.pImmutableSamplers = (VkSampler *)0x0;
    binding.binding = 0;
    binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    binding.descriptorCount = 0;
    binding.stageFlags = 0;
    (this->m_descriptorSets).
    super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar7].m_internal = uVar5;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&binding);
    binding.binding = 0xd;
    binding.descriptorCount = 0;
    binding.stageFlags = 0;
    binding.pImmutableSamplers =
         (VkSampler *)((ulong)binding.pImmutableSamplers & 0xffffffff00000000);
    result = (*deviceInterface->_vptr_DeviceInterface[0x23])
                       (deviceInterface,device,&binding,0,
                        (this->m_bufferViews).
                        super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar7);
    ::vk::checkResult(result,
                      "vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                      ,0x1618);
    binding.binding = 0x23;
    binding.descriptorCount = 0;
    binding.stageFlags = 0;
    binding.pImmutableSamplers =
         (VkSampler *)
         (this->m_descriptorSets).
         super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7].m_internal;
    (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,&binding,0,0);
  }
  std::
  _Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ::~_Vector_base(&bindings.
                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                 );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_398);
  return;
}

Assistant:

void RenderVertexStorageTexelBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::InstanceInterface&				vki						= context.getContext().getInstanceInterface();
	const vk::VkPhysicalDevice					physicalDevice			= context.getContext().getPhysicalDevice();
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-texel-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_device				= device;
	m_vkd					= &vkd;
	m_bufferSize			= context.getBufferSize();
	m_maxStorageTexelCount	= vk::getPhysicalDeviceProperties(vki, physicalDevice).limits.maxTexelBufferElements;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const deUint32							descriptorCount	= (deUint32)(divRoundUp(m_bufferSize, (vk::VkDeviceSize)m_maxStorageTexelCount * 4));
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
		m_descriptorSets.resize(descriptorCount, (vk::VkDescriptorSet)0);
		m_bufferViews.resize(descriptorCount, (vk::VkBufferView)0);
	}

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSets[descriptorSetNdx] = vk::allocateDescriptorSet(vkd, device, &allocateInfo).disown();

		{
			const vk::VkBufferViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getBuffer(),
				vk::VK_FORMAT_R32_UINT,
				descriptorSetNdx * m_maxStorageTexelCount * 4,
				(deUint32)de::min<vk::VkDeviceSize>(m_maxStorageTexelCount * 4, m_bufferSize - descriptorSetNdx * m_maxStorageTexelCount * 4)
			};

			VK_CHECK(vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx]));
		}

		{
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSets[descriptorSetNdx],
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
				DE_NULL,
				DE_NULL,
				&m_bufferViews[descriptorSetNdx]
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}